

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_strategy.cpp
# Opt level: O0

void __thiscall
EscapeStrategy::generateActions(EscapeStrategy *this,PlayerSight *sight,Actions *actions)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  Randomizer *this_00;
  Router *this_01;
  reference pPVar4;
  float fVar5;
  Vec2 local_a4;
  float local_9c;
  undefined1 auStack_98 [4];
  float dis;
  PUnitInfo uinfo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PUnitInfo,_std::allocator<PUnitInfo>_> *__range2;
  float score;
  Vec2 local_54;
  Vec2 local_4c;
  Vec2 local_44;
  Vec2 e0;
  float rad;
  Vec2 goal;
  int i;
  float best_score;
  Vec2 best;
  Actions *actions_local;
  PlayerSight *sight_local;
  EscapeStrategy *this_local;
  
  if (((this->super_Strategy).disabled & 1U) == 0) {
    _i = sight->pos;
    goal.y = 0.0;
    for (goal.x = 0.0; (int)goal.x < this->tries; goal.x = (float)((int)goal.x + 1)) {
      Vec2::Vec2((Vec2 *)&e0.y,0.0,0.0);
      do {
        this_00 = Randomizer::getInstance();
        fVar5 = Randomizer::randXAxis(this_00);
        e0.x = (fVar5 * 3.1415927) / 60.0 + 3.1415927;
        dVar1 = std::cos((double)(ulong)(uint)e0.x);
        dVar2 = std::sin((double)(ulong)(uint)e0.x);
        Vec2::Vec2(&local_44,SUB84(dVar1,0),SUB84(dVar2,0));
        local_54 = Vec2::operator*(&local_44,2.0);
        local_4c = Vec2::operator+(&sight->pos,&local_54);
        unique0x10000319 = local_4c;
        this_01 = Router::getInstance();
        bVar3 = Router::Reachable(this_01,stack0xffffffffffffffc8);
      } while (bVar3);
      __range2._4_4_ = 0.0;
      __end2 = std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::begin(&sight->unitInSight);
      register0x00000000 =
           std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::end(&sight->unitInSight);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
                                         *)&uinfo.velocity.y), bVar3) {
        pPVar4 = __gnu_cxx::
                 __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
                 ::operator*(&__end2);
        uinfo.pos.y = (pPVar4->velocity).y;
        auStack_98 = pPVar4->id;
        unique0x100001f0 = (pPVar4->pos).x;
        uinfo._0_8_ = *(undefined8 *)&(pPVar4->pos).y;
        local_a4 = Vec2::operator-((Vec2 *)&dis,&sight->pos);
        local_9c = Vec2::length(&local_a4);
        if (local_9c < 0.0001) {
          __range2._4_4_ = 1e+08;
          break;
        }
        __range2._4_4_ = 1.0 / local_9c + __range2._4_4_;
        __gnu_cxx::
        __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>::
        operator++(&__end2);
      }
      if (__range2._4_4_ < goal.y) {
        goal.y = __range2._4_4_;
        _i = stack0xffffffffffffffc8;
      }
    }
    Actions::emplace(actions,SelectDestination,sight->id,_i);
  }
  return;
}

Assistant:

void EscapeStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    Vec2 best(sight.pos);
    float best_score = 0;
    for (int i = 0; i < tries; ++i)
    {
        Vec2 goal;
        do          //使用Randomizer的AxisRnd，通过变换生成一个均匀分布在(0, 2π)的随机角度
        {
            float rad = (Randomizer::getInstance()->randXAxis()) * PI / MapWidth + PI;
            Vec2 e0(cos(rad), sin(rad));
            goal = sight.pos + e0 * PlayerVelocity;
        } while (Router::getInstance()->Reachable(goal));
        float score = 0;
        for (auto uinfo : sight.unitInSight)
        {
            float dis = (uinfo.pos - sight.pos).length();
            if (dis < EPS)
            {
                score = FINF;
                break;
            }
            score += 1 / dis;
        }
        if (score < best_score)
        {
            best_score = score;
            best = goal;
        }
    }
    actions->emplace(SelectDestination, sight.id, best);
}